

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void __thiscall FRemapTable::Serialize(FRemapTable *this,FSerializer *arc)

{
  int iVar1;
  int count;
  
  iVar1 = this->NumEntries;
  FSerializer::operator()(arc,"numentries",&this->NumEntries);
  count = this->NumEntries;
  if ((arc->r != (FReader *)0x0) && (iVar1 != count)) {
    Free(this);
    Alloc(this,this->NumEntries);
    count = this->NumEntries;
  }
  FSerializer::Array<unsigned_char>(arc,"remap",this->Remap,count,false);
  FSerializer::Array<PalEntry>(arc,"palette",this->Palette,this->NumEntries,false);
  return;
}

Assistant:

void FRemapTable::Serialize(FSerializer &arc)
{
	int n = NumEntries;

	arc("numentries", NumEntries);
	if (arc.isReading())
	{
		if (n != NumEntries)
		{
			Free();
			Alloc(NumEntries);
		}
	}
	arc.Array("remap", Remap, NumEntries);
	arc.Array("palette", Palette, NumEntries);
}